

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O2

void __thiscall antlr::TokenBuffer::rewind(TokenBuffer *this,FILE *__stream)

{
  syncConsume(this);
  this->markerOffset = (uint)__stream;
  this->nMarkers = this->nMarkers - 1;
  return;
}

Assistant:

void TokenBuffer::rewind(unsigned int mark)
{
	syncConsume();
	markerOffset=mark;
	nMarkers--;
}